

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

ForLoopStatementSyntax * __thiscall
slang::parsing::Parser::parseForLoopStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token openParen;
  Token semi1;
  Token semi2_00;
  bool bVar1;
  int iVar2;
  ExpressionSyntax *stopExpr;
  ExpressionSyntax *pEVar3;
  SyntaxNode *pSVar4;
  StatementSyntax *statement;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ForLoopStatementSyntax *pFVar5;
  __extent_storage<18446744073709551615UL> _Var6;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  TokenKind TVar7;
  undefined8 uVar8;
  bool bVar9;
  Token TVar10;
  Token TVar11;
  Token TVar12;
  SourceRange range;
  string_view syntaxName;
  Token forKeyword;
  Token closeParen;
  Token semi2;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> steps;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> initializers;
  Info *local_270;
  Token local_268;
  Token local_258;
  Info *local_248;
  Info *local_240;
  undefined8 local_238;
  NamedLabelSyntax *local_230;
  Info *local_228;
  undefined8 local_220;
  pointer local_218;
  SourceLocation local_210;
  Token local_208;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1f8;
  ulong local_1e8;
  undefined8 uStack_1e0;
  SourceLocation local_1d8;
  pointer local_1d0;
  SourceLocation local_1c8;
  undefined8 local_1c0;
  Info *pIStack_1b8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1b0;
  ulong local_1a0;
  undefined1 local_198 [96];
  Token local_138;
  Token local_128;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_e0 [2];
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_68;
  
  _Var6 = attributes._M_extent._M_extent_value;
  local_218 = attributes._M_ptr;
  local_230 = label;
  local_210 = (SourceLocation)_Var6._M_extent_value;
  TVar10 = ParserBase::consume(&this->super_ParserBase);
  local_240 = TVar10.info;
  local_238 = TVar10._0_8_;
  TVar10 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_228 = TVar10.info;
  local_220 = TVar10._0_8_;
  Token::Token(&local_258);
  local_e0[0].data_ = (pointer)local_e0[0].firstElement;
  local_e0[0].len = 0;
  local_e0[0].cap = 4;
  bVar1 = isVariableDeclaration(this);
  if (bVar1) {
    TVar10 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar10.kind);
    if (bVar1) {
      local_258 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleForInitializer(TVar10.kind);
      if (bVar1) {
        do {
          local_270 = TVar10.info;
          pSVar4 = parseForInitializer(this);
          local_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar4;
          local_1a0 = CONCAT71(local_1a0._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_e0,(TokenOrSyntax *)&local_1b0._M_first);
          TVar11 = ParserBase::peek(&this->super_ParserBase);
          TVar7 = TVar11.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7);
          _Var6._M_extent_value._0_1_ = TVar7 != Comma || bVar1;
          iVar2 = 3;
          if (TVar7 == Comma && !bVar1) {
            local_1b0._M_first._M_storage =
                 (_Uninitialized<slang::parsing::Token,_true>)
                 ParserBase::expect(&this->super_ParserBase,Comma);
            local_1a0 = local_1a0 & 0xffffffffffffff00;
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      (local_e0,(TokenOrSyntax *)&local_1b0._M_first);
            TVar11 = ParserBase::peek(&this->super_ParserBase);
            TVar7 = TVar11.kind;
            bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7);
            _Var6._M_extent_value._0_1_ = TVar7 != EndOfFile;
            if (TVar7 != EndOfFile && !bVar1) {
              bVar1 = TVar10.kind == TVar7;
              bVar9 = local_270 == TVar11.info;
              _Var6._M_extent_value._0_1_ = bVar9 && bVar1;
              if ((!bVar9 || !bVar1) ||
                 (bVar1 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleForInitializer,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                    (&this->super_ParserBase,(DiagCode)0x3c0005,true), bVar1)) {
                iVar2 = 0;
                TVar10 = TVar11;
              }
            }
            else {
              ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            }
          }
        } while (iVar2 == 0);
        if (iVar2 == 3) {
          local_258 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        }
      }
      else {
        _Var6._M_extent_value = 0x13;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar10,Semicolon,&local_258,(DiagCode)0x3c0005);
      }
    }
  }
  else {
    TVar10 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar10.kind);
    if (bVar1) {
      local_258 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar10.kind);
      if (bVar1) {
        do {
          local_270 = TVar10.info;
          pSVar4 = &parseExpression(this)->super_SyntaxNode;
          if (pSVar4->kind != AssignmentExpression) {
            if (pSVar4->kind == IdentifierName) {
              TVar11 = slang::syntax::SyntaxNode::getFirstToken(pSVar4);
              if ((TVar11._0_4_ >> 0x10 & 1) != 0) goto LAB_002fb591;
            }
            range = slang::syntax::SyntaxNode::sourceRange(pSVar4);
            _Var6._M_extent_value = (size_t)range.endLoc;
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x6d0005,range);
          }
LAB_002fb591:
          local_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar4;
          local_1a0 = CONCAT71(local_1a0._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_e0,(TokenOrSyntax *)&local_1b0._M_first);
          TVar11 = ParserBase::peek(&this->super_ParserBase);
          TVar7 = TVar11.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7);
          _Var6._M_extent_value._0_1_ = TVar7 != Comma || bVar1;
          iVar2 = 3;
          if (TVar7 == Comma && !bVar1) {
            local_1b0._M_first._M_storage =
                 (_Uninitialized<slang::parsing::Token,_true>)
                 ParserBase::expect(&this->super_ParserBase,Comma);
            local_1a0 = local_1a0 & 0xffffffffffffff00;
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      (local_e0,(TokenOrSyntax *)&local_1b0._M_first);
            TVar11 = ParserBase::peek(&this->super_ParserBase);
            TVar7 = TVar11.kind;
            bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7);
            _Var6._M_extent_value._0_1_ = TVar7 != EndOfFile;
            if (TVar7 != EndOfFile && !bVar1) {
              bVar1 = TVar10.kind == TVar7;
              bVar9 = local_270 == TVar11.info;
              _Var6._M_extent_value._0_1_ = bVar9 && bVar1;
              if ((!bVar9 || !bVar1) ||
                 (bVar1 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                    (&this->super_ParserBase,(DiagCode)0x3c0005,true), bVar1)) {
                iVar2 = 0;
                TVar10 = TVar11;
              }
            }
            else {
              ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            }
          }
        } while (iVar2 == 0);
        if (iVar2 == 3) {
          local_258 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        }
      }
      else {
        _Var6._M_extent_value = 0x13;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar10,Semicolon,&local_258,(DiagCode)0x3c0005);
      }
    }
  }
  Token::Token(&local_208);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Semicolon);
  if (bVar1) {
    local_208 = ParserBase::consume(&this->super_ParserBase);
    stopExpr = (ExpressionSyntax *)0x0;
  }
  else {
    stopExpr = parseExpression(this);
    local_208 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  Token::Token(&local_268);
  local_1b0._M_first._M_storage.info = (Info *)0x0;
  local_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_198;
  local_1a0 = 4;
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar10.kind);
  if (bVar1) {
    local_268 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar10.kind);
    if (bVar1) {
      do {
        local_248 = TVar10.info;
        uVar8 = TVar10._0_8_;
        pEVar3 = parseExpression(this);
        local_1f8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar3;
        local_1e8 = CONCAT71(local_1e8._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1b0._M_first,
                   (TokenOrSyntax *)&local_1f8._M_first);
        TVar11 = ParserBase::peek(&this->super_ParserBase);
        TVar7 = TVar11.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7);
        TVar11.info = local_248;
        TVar11.kind = (short)uVar8;
        TVar11._2_1_ = (char)((ulong)uVar8 >> 0x10);
        TVar11.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
        TVar11.rawLen = (int)((ulong)uVar8 >> 0x20);
        _Var6._M_extent_value._0_1_ = TVar7 == EndOfFile || bVar1;
        iVar2 = 3;
        if (TVar7 != EndOfFile && !bVar1) {
          if (TVar7 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_268 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                TVar11.info = local_248;
                TVar11.kind = (short)uVar8;
                TVar11._2_1_ = (char)((ulong)uVar8 >> 0x10);
                TVar11.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
                TVar11.rawLen = (int)((ulong)uVar8 >> 0x20);
                iVar2 = 1;
                goto LAB_002fb3e2;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_1f8._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_1e8 = local_1e8 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1b0._M_first,
                     (TokenOrSyntax *)&local_1f8._M_first);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          TVar7 = TVar12.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7);
          _Var6._M_extent_value._0_1_ = TVar7 != EndOfFile;
          if (TVar7 != EndOfFile && !bVar1) {
            bVar1 = TVar10.kind == TVar7;
            bVar9 = local_248 == TVar12.info;
            _Var6._M_extent_value._0_1_ = bVar9 && bVar1;
            if (bVar9 && bVar1) {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,true);
              TVar11.info = local_248;
              TVar11.kind = (short)uVar8;
              TVar11._2_1_ = (char)((ulong)uVar8 >> 0x10);
              TVar11.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
              TVar11.rawLen = (int)((ulong)uVar8 >> 0x20);
              if (!bVar1) goto LAB_002fb3e2;
            }
            iVar2 = 0;
            TVar11 = TVar12;
          }
          else {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            TVar11.info = local_248;
            TVar11.kind = (short)uVar8;
            TVar11._2_1_ = (char)((ulong)uVar8 >> 0x10);
            TVar11.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
            TVar11.rawLen = (int)((ulong)uVar8 >> 0x20);
          }
        }
LAB_002fb3e2:
        TVar10 = TVar11;
        local_248 = TVar10.info;
      } while (iVar2 == 0);
      if (iVar2 == 3) {
        local_268 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      }
    }
    else {
      _Var6._M_extent_value = 0x12;
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar10,CloseParenthesis,&local_268,(DiagCode)0x10001);
    }
  }
  statement = parseStatement(this,true,false);
  TVar10 = local_268;
  TVar12.info = (Info *)_Var6._M_extent_value;
  TVar12.kind = local_268.kind;
  TVar12._2_1_ = local_268._2_1_;
  TVar12.numFlags.raw = local_268.numFlags.raw;
  TVar12.rawLen = local_268.rawLen;
  syntaxName._M_str = "for loop";
  syntaxName._M_len = 8;
  local_268 = TVar10;
  checkEmptyBody(this,&statement->super_SyntaxNode,TVar12,syntaxName);
  local_1f8._8_4_ = 1;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1d8 = local_210;
  local_1d0 = local_218;
  local_1c8 = local_210;
  local_1f8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006dc3a8;
  local_1c0 = local_220;
  pIStack_1b8 = local_228;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_e0,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  TVar11 = local_208;
  TVar10 = local_258;
  local_118.elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
  local_118.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_118.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_118.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_118.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006dcfc8;
  local_128.kind = local_258.kind;
  local_128._2_1_ = local_258._2_1_;
  local_128.numFlags.raw = local_258.numFlags.raw;
  local_128.rawLen = local_258.rawLen;
  local_128.info = local_258.info;
  local_138.kind = local_208.kind;
  local_138._2_1_ = local_208._2_1_;
  local_138.numFlags.raw = local_208.numFlags.raw;
  local_138.rawLen = local_208.rawLen;
  local_138.info = local_208.info;
  local_258 = TVar10;
  local_208 = TVar11;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1b0._M_first,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
  local_68.elements._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar2);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006dca30;
  openParen.info = pIStack_1b8;
  openParen.kind = (undefined2)local_1c0;
  openParen._2_1_ = local_1c0._2_1_;
  openParen.numFlags.raw = local_1c0._3_1_;
  openParen.rawLen = local_1c0._4_4_;
  semi1.info = local_128.info;
  semi1.kind = local_128.kind;
  semi1._2_1_ = local_128._2_1_;
  semi1.numFlags.raw = local_128.numFlags.raw;
  semi1.rawLen = local_128.rawLen;
  semi2_00.info = local_138.info;
  semi2_00.kind = local_138.kind;
  semi2_00._2_1_ = local_138._2_1_;
  semi2_00.numFlags.raw = local_138.numFlags.raw;
  semi2_00.rawLen = local_138.rawLen;
  forKeyword.info = local_240;
  forKeyword.kind = (undefined2)local_238;
  forKeyword._2_1_ = local_238._2_1_;
  forKeyword.numFlags.raw = local_238._3_1_;
  forKeyword.rawLen = local_238._4_4_;
  pFVar5 = slang::syntax::SyntaxFactory::forLoopStatement
                     (&this->factory,local_230,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_1f8._M_first,
                      forKeyword,openParen,&local_118,semi1,stopExpr,semi2_00,&local_68,local_268,
                      statement);
  if (local_1b0._M_rest != (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_198) {
    operator_delete((void *)local_1b0._M_rest);
  }
  if (local_e0[0].data_ != (pointer)local_e0[0].firstElement) {
    operator_delete(local_e0[0].data_);
  }
  return pFVar5;
}

Assistant:

ForLoopStatementSyntax& Parser::parseForLoopStatement(NamedLabelSyntax* label,
                                                      AttrList attributes) {
    auto forKeyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);

    Token semi1;
    SmallVector<TokenOrSyntax, 4> initializers;

    if (isVariableDeclaration()) {
        parseList<isPossibleForInitializer, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] { return &parseForInitializer(); });
    }
    else {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] {
                auto& expr = parseExpression();
                if (expr.kind != SyntaxKind::AssignmentExpression &&
                    (expr.kind != SyntaxKind::IdentifierName ||
                     !expr.getFirstToken().isMissing())) {
                    // Initializer expressions must be variable assignments.
                    addDiag(diag::InvalidForInitializer, expr.sourceRange());
                }
                return &expr;
            });
    }

    ExpressionSyntax* stopExpr = nullptr;
    Token semi2;
    if (peek(TokenKind::Semicolon)) {
        semi2 = consume();
    }
    else {
        stopExpr = &parseExpression();
        semi2 = expect(TokenKind::Semicolon);
    }

    Token closeParen;
    SmallVector<TokenOrSyntax, 4> steps;
    parseList<isPossibleExpressionOrComma, isEndOfParenList>(
        steps, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedExpression, [this] { return &parseExpression(); });

    auto& body = parseStatement();

    checkEmptyBody(body, closeParen, "for loop"sv);

    return factory.forLoopStatement(label, attributes, forKeyword, openParen,
                                    initializers.copy(alloc), semi1, stopExpr, semi2,
                                    steps.copy(alloc), closeParen, body);
}